

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

void __thiscall
Ratio::Ratio(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *e,
            vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *f)

{
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RSI;
  double *in_RDI;
  double dVar1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_00000018;
  
  dVar1 = geoAvg(in_RSI);
  *in_RDI = dVar1;
  dVar1 = geoAvg(in_RSI);
  in_RDI[1] = dVar1;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(f,in_stack_00000018);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(f,in_stack_00000018);
  return;
}

Assistant:

Ratio::Ratio(vector<PhyloTreeEdge>& e, vector<PhyloTreeEdge>& f) :
        eEdges(e), fEdges(f), eLength(geoAvg(e)), fLength(geoAvg(f)) {
}